

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O0

void zlib_file(char *name,zlib_wrapper type,int width,int check,bool output_csv_format)

{
  allocator<const_char_*> *this;
  allocator<unsigned_long> *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  size_t sVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  int *piVar6;
  pointer pcVar7;
  reference ppcVar8;
  reference pvVar9;
  reference pvVar10;
  reference output_00;
  double dVar11;
  long lVar12;
  rep rVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double compress_ratio;
  double inflate_rate_max;
  double deflate_rate_max;
  double inflate_rate_med;
  double deflate_rate_med;
  size_t i;
  size_t output_length;
  time_point tStack_200;
  int b_6;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f8;
  duration<double,_std::ratio<1L,_1L>_> local_1f0;
  int local_1e8;
  int local_1e4;
  int b_5;
  int r_1;
  int local_1d8;
  int local_1d4;
  int b_4;
  int b_3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1c8;
  duration<double,_std::ratio<1L,_1L>_> local_1c0;
  int local_1b8;
  int local_1b4;
  int r;
  int b_2;
  time_point start;
  anon_class_1_0_00000001 local_19d;
  int b_1;
  anon_class_1_0_00000001 now;
  double dStack_198;
  int run;
  double utime [5];
  double local_168;
  double ctime [5];
  int runs;
  int repeats;
  int mega_byte;
  int local_124;
  int input_limit;
  int input_start;
  int b;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  undefined1 local_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compressed;
  undefined1 local_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_length;
  undefined1 local_b8 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> input;
  int blocks;
  int block_size;
  char *strategy;
  string local_80 [32];
  pointer local_60;
  char *data;
  undefined1 local_50 [4];
  int length;
  Data file;
  bool output_csv_format_local;
  int check_local;
  int width_local;
  zlib_wrapper type_local;
  char *name_local;
  
  file._43_1_ = output_csv_format;
  file._44_4_ = check;
  read_file_data_or_exit((Data *)local_50,name);
  data._4_4_ = (uint)file.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_60 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)local_50);
  if (file._44_4_ == 0) {
    pcVar4 = zlib_level_strategy_name(zlib_compression_level);
    if ((file._43_1_ & 1) == 0) {
      printf("%s%-40s :\n",pcVar4,name);
    }
    input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x100000;
    iVar2 = data._4_4_ + 0xfffff;
    if ((int)(data._4_4_ + 0xfffff) < 0) {
      iVar2 = data._4_4_ + 0x1ffffe;
    }
    input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = iVar2 >> 0x14;
    sVar5 = (size_type)
            (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    this = (allocator<const_char_*> *)
           ((long)&input_length.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<const_char_*>::allocator(this);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8,sVar5,this);
    std::allocator<const_char_*>::~allocator
              ((allocator<const_char_*> *)
               ((long)&input_length.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar5 = (size_type)
            (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    this_00 = (allocator<unsigned_long> *)
              ((long)&compressed.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,sVar5,this_00);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&compressed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar5 = (size_type)
            (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&output.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,sVar5,this_01);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&output.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar5 = (size_type)
            (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&input_start + 3));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&b,sVar5,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&input_start + 3));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&input_start + 3));
    for (input_limit = 0;
        input_limit <
        (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; input_limit = input_limit + 1) {
      local_124 = input_limit << 0x14;
      repeats = input_limit * 0x100000 + 0x100000;
      piVar6 = std::min<int>(&repeats,(int *)((long)&data + 4));
      mega_byte = *piVar6;
      pcVar7 = local_60 + local_124;
      ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8,
                           (long)input_limit);
      *ppcVar8 = pcVar7;
      iVar2 = mega_byte - local_124;
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                          (long)input_limit);
      *pvVar9 = (long)iVar2;
    }
    iVar2 = (int)(data._4_4_ + 0xa00000) / (int)(data._4_4_ + 1);
    for (b_1 = 0; b_1 < 5; b_1 = b_1 + 1) {
      for (start.__d.__r._4_4_ = 0;
          start.__d.__r._4_4_ <
          (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_f8,(long)start.__d.__r._4_4_);
        zlib_estimate_compressed_size(0x100000);
        std::__cxx11::string::resize((ulong)pvVar10);
      }
      _r = zlib_file::anon_class_1_0_00000001::operator()(&local_19d);
      for (local_1b4 = 0;
          local_1b4 <
          (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_1b4 = local_1b4 + 1) {
        for (local_1b8 = 0; local_1b8 < iVar2; local_1b8 = local_1b8 + 1) {
          ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8,
                               (long)local_1b4);
          pcVar4 = *ppcVar8;
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                              (long)local_1b4);
          sVar1 = *pvVar9;
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_f8,(long)local_1b4);
          zlib_compress(type,pcVar4,sVar1,pvVar10,false);
        }
      }
      _b_4 = zlib_file::anon_class_1_0_00000001::operator()(&local_19d);
      local_1c8.__r =
           (rep_conflict)
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&b_4,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&r);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_1c0,&local_1c8);
      rVar13 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1c0);
      ctime[(long)b_1 + -1] = rVar13;
      for (local_1d4 = 0;
          local_1d4 <
          (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_1d4 = local_1d4 + 1) {
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8,
                             (long)local_1d4);
        pcVar4 = *ppcVar8;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                            (long)local_1d4);
        sVar1 = *pvVar9;
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_f8,(long)local_1d4);
        zlib_compress(type,pcVar4,sVar1,pvVar10,true);
      }
      for (local_1d8 = 0;
          local_1d8 <
          (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_1d8 = local_1d8 + 1) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&b,(long)local_1d8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,(long)local_1d8
                  );
        std::__cxx11::string::resize((ulong)pvVar10);
      }
      _b_5 = zlib_file::anon_class_1_0_00000001::operator()(&local_19d);
      _r = _b_5;
      for (local_1e4 = 0; local_1e4 < iVar2; local_1e4 = local_1e4 + 1) {
        for (local_1e8 = 0;
            local_1e8 <
            (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; local_1e8 = local_1e8 + 1) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_f8,(long)local_1e8);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                              (long)local_1e8);
          sVar1 = *pvVar9;
          output_00 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&b,(long)local_1e8);
          zlib_uncompress(type,pvVar10,sVar1,output_00);
        }
      }
      tStack_200 = zlib_file::anon_class_1_0_00000001::operator()(&local_19d);
      local_1f8.__r =
           (rep_conflict)
           std::chrono::operator-
                     (&stack0xfffffffffffffe00,
                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&r);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_1f0,&local_1f8);
      rVar13 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1f0);
      utime[(long)b_1 + -1] = rVar13;
      for (output_length._4_4_ = 0;
          output_length._4_4_ <
          (int)input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          output_length._4_4_ = output_length._4_4_ + 1) {
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8,
                             (long)output_length._4_4_);
        pcVar4 = *ppcVar8;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                            (long)output_length._4_4_);
        sVar1 = *pvVar9;
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&b,(long)output_length._4_4_);
        verify_equal(pcVar4,sVar1,pvVar10);
      }
    }
    i = 0;
    deflate_rate_med = 0.0;
    while( true ) {
      dVar11 = (double)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_f8);
      if ((ulong)dVar11 <= (ulong)deflate_rate_med) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f8,(size_type)deflate_rate_med);
      lVar12 = std::__cxx11::string::size();
      i = lVar12 + i;
      deflate_rate_med = (double)((long)deflate_rate_med + 1);
    }
    std::sort<double*>(&local_168,ctime + 4);
    std::sort<double*>(&stack0xfffffffffffffe68,utime + 4);
    iVar3 = data._4_4_ * iVar2;
    if (iVar3 < 0) {
      iVar3 = iVar3 + 0xfffff;
    }
    dVar11 = (double)(iVar3 >> 0x14) / ctime[1];
    iVar3 = data._4_4_ * iVar2;
    if (iVar3 < 0) {
      iVar3 = iVar3 + 0xfffff;
    }
    dVar14 = (double)(iVar3 >> 0x14) / utime[1];
    iVar3 = data._4_4_ * iVar2;
    if (iVar3 < 0) {
      iVar3 = iVar3 + 0xfffff;
    }
    local_168 = (double)(iVar3 >> 0x14) / local_168;
    iVar2 = data._4_4_ * iVar2;
    if (iVar2 < 0) {
      iVar2 = iVar2 + 0xfffff;
    }
    dStack_198 = (double)(iVar2 >> 0x14) / dStack_198;
    auVar16._8_4_ = (int)(i >> 0x20);
    auVar16._0_8_ = i;
    auVar16._12_4_ = 0x45300000;
    dVar15 = (((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)) * 100.0) /
             (double)(int)data._4_4_;
    if ((file._43_1_ & 1) == 0) {
      pcVar4 = zlib_wrapper_name(type);
      printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%",dVar15,pcVar4,1,(ulong)(uint)width,
             (ulong)data._4_4_,(ulong)(uint)width,(int)i);
      printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",dVar11,local_168,dVar14,
             dStack_198);
    }
    else {
      printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n",dVar11,dVar14,local_168,dStack_198,dVar15,
             name);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_b8);
  }
  else {
    std::__cxx11::string::find_last_of((char *)&file.size,0x1081b7);
    std::__cxx11::string::substr((ulong)local_80,(ulong)&file.size);
    std::__cxx11::string::operator=((string *)&file.size,local_80);
    std::__cxx11::string::~string(local_80);
    check_file((Data *)local_50,type,file._44_4_);
  }
  Data::~Data((Data *)local_50);
  return;
}

Assistant:

void zlib_file(const char* name,
               zlib_wrapper type,
               int width,
               int check,
               bool output_csv_format) {
  /*
   * Read the file data.
   */
  struct Data file = read_file_data_or_exit(name);
  const int length = static_cast<int>(file.size);
  const char* data = file.data.get();

  /*
   * Compress file: report output data checks and return.
   */
  if (check) {
    file.name = file.name.substr(file.name.find_last_of("/\\") + 1);
    check_file(file, type, check);
    return;
  }

  /*
   * Report compression strategy and file name.
   */
  const char* strategy = zlib_level_strategy_name(zlib_compression_level);
  if (!output_csv_format) {
    printf("%s%-40s :\n", strategy, name);
  }

  /*
   * Chop the data into blocks.
   */
  const int block_size = 1 << 20;
  const int blocks = (length + block_size - 1) / block_size;

  std::vector<const char*> input(blocks);
  std::vector<size_t> input_length(blocks);
  std::vector<std::string> compressed(blocks);
  std::vector<std::string> output(blocks);

  for (int b = 0; b < blocks; ++b) {
    int input_start = b * block_size;
    int input_limit = std::min<int>((b + 1) * block_size, length);
    input[b] = data + input_start;
    input_length[b] = input_limit - input_start;
  }

  /*
   * Run the zlib compress/uncompress loop a few times with |repeats| to
   * process about 10MB of data if the length is small relative to 10MB.
   * If length is large relative to 10MB, process the data once.
   */
  const int mega_byte = 1024 * 1024;
  const int repeats = (10 * mega_byte + length) / (length + 1);
  const int runs = 5;
  double ctime[runs];
  double utime[runs];

  for (int run = 0; run < runs; ++run) {
    const auto now = [] { return std::chrono::steady_clock::now(); };

    // Pre-grow the output buffer so we don't measure string resize time.
    for (int b = 0; b < blocks; ++b)
      compressed[b].resize(zlib_estimate_compressed_size(block_size));

    auto start = now();
    for (int b = 0; b < blocks; ++b)
      for (int r = 0; r < repeats; ++r)
        zlib_compress(type, input[b], input_length[b], &compressed[b]);
    ctime[run] = std::chrono::duration<double>(now() - start).count();

    // Compress again, resizing compressed, so we don't leave junk at the
    // end of the compressed string that could confuse zlib_uncompress().
    for (int b = 0; b < blocks; ++b)
      zlib_compress(type, input[b], input_length[b], &compressed[b], true);

    for (int b = 0; b < blocks; ++b)
      output[b].resize(input_length[b]);

    start = now();
    for (int r = 0; r < repeats; ++r)
      for (int b = 0; b < blocks; ++b)
        zlib_uncompress(type, compressed[b], input_length[b], &output[b]);
    utime[run] = std::chrono::duration<double>(now() - start).count();

    for (int b = 0; b < blocks; ++b)
      verify_equal(input[b], input_length[b], &output[b]);
  }

  /*
   * Output the median/maximum compress/uncompress rates in MB/s.
   */
  size_t output_length = 0;
  for (size_t i = 0; i < compressed.size(); ++i)
    output_length += compressed[i].size();

  std::sort(ctime, ctime + runs);
  std::sort(utime, utime + runs);

  double deflate_rate_med, inflate_rate_med, deflate_rate_max, inflate_rate_max;
  deflate_rate_med = length * repeats / mega_byte / ctime[runs / 2];
  inflate_rate_med = length * repeats / mega_byte / utime[runs / 2];
  deflate_rate_max = length * repeats / mega_byte / ctime[0];
  inflate_rate_max = length * repeats / mega_byte / utime[0];
  double compress_ratio = output_length * 100.0 / length;

  if (!output_csv_format) {
    // type, block size, compression ratio, etc
    printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%", zlib_wrapper_name(type),
           block_size / (1 << 20), width, length, width,
           unsigned(output_length), compress_ratio);

    // compress / uncompress median (max) rates
    printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",
           deflate_rate_med, deflate_rate_max, inflate_rate_med,
           inflate_rate_max);
  } else {
    printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n", name, deflate_rate_med,
           inflate_rate_med, deflate_rate_max, inflate_rate_max,
           compress_ratio);
  }
}